

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,string *srcName,string *apiName,
               UniformLayout *layout,int blockNdx,void *basePtr,deUint32 unusedMask,
               MatrixLoadFlags matrixLoadFlag)

{
  DataType dataType;
  bool bVar1;
  UniformLayout *pUVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  UniformLayoutEntry *entry;
  ostream *poVar6;
  int elemNdx;
  char *pcVar7;
  uint uVar8;
  int *resultVar_00;
  undefined4 in_stack_0000000c;
  MatrixLoadFlags MVar9;
  string elementApiName;
  string elementSrcName;
  allocator<char> local_99;
  string op;
  string local_78;
  UniformLayout *local_58;
  string fullApiName;
  
  local_58 = (UniformLayout *)apiName;
  if (*(int *)resultVar == 0) {
    pcVar7 = "";
    bVar1 = false;
    resultVar_00 = (int *)resultVar;
  }
  else {
    if (*(int *)resultVar != 1) {
      lVar4 = *(long *)(resultVar + 8);
      pcVar7 = (char *)(*(long *)(lVar4 + 0x20) + 0x20);
      while( true ) {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar7 + -0x20) ==
            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar4 + 0x28))
        break;
        if ((*(uint *)(pcVar7 + 0x18) & (uint)basePtr) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elementSrcName,".",(allocator<char> *)&elementApiName);
          std::operator+(&op,&elementSrcName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar7 + -0x20));
          std::__cxx11::string::~string((string *)&elementSrcName);
          std::__cxx11::string::string((string *)&elementApiName,(string *)type);
          std::operator+(&elementSrcName,&elementApiName,&op);
          std::__cxx11::string::~string((string *)&elementApiName);
          std::__cxx11::string::string((string *)&local_78,(string *)srcName);
          std::operator+(&elementApiName,&local_78,&op);
          MVar9 = 0x6682b5;
          std::__cxx11::string::~string((string *)&local_78);
          generateCompareSrc(src,pcVar7,(VarType *)&elementSrcName,&elementApiName,
                             (string *)local_58,(UniformLayout *)((ulong)layout & 0xffffffff),
                             blockNdx,(void *)((ulong)basePtr & 0xffffffff),0,MVar9);
          std::__cxx11::string::~string((string *)&elementApiName);
          std::__cxx11::string::~string((string *)&elementSrcName);
          std::__cxx11::string::~string((string *)&op);
          lVar4 = *(long *)(resultVar + 8);
        }
        pcVar7 = pcVar7 + 0x40;
      }
      return;
    }
    resultVar_00 = *(int **)(resultVar + 8);
    if (*resultVar_00 != 0) {
      for (fullApiName._M_dataplus._M_p._0_4_ = 0;
          (int)fullApiName._M_dataplus._M_p < *(int *)(resultVar + 0x10);
          fullApiName._M_dataplus._M_p._0_4_ = (int)fullApiName._M_dataplus._M_p + 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&elementApiName,"[",&local_99);
        de::toString<int>(&local_78,(int *)&fullApiName);
        std::operator+(&elementSrcName,&elementApiName,&local_78);
        std::operator+(&op,&elementSrcName,"]");
        std::__cxx11::string::~string((string *)&elementSrcName);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&elementApiName);
        std::__cxx11::string::string((string *)&elementApiName,(string *)type);
        std::operator+(&elementSrcName,&elementApiName,&op);
        std::__cxx11::string::~string((string *)&elementApiName);
        std::__cxx11::string::string((string *)&local_78,(string *)srcName);
        std::operator+(&elementApiName,&local_78,&op);
        MVar9 = 0x668195;
        std::__cxx11::string::~string((string *)&local_78);
        generateCompareSrc(src,(char *)resultVar_00,(VarType *)&elementSrcName,&elementApiName,
                           (string *)local_58,(UniformLayout *)((ulong)layout & 0xffffffff),blockNdx
                           ,(void *)((ulong)basePtr & 0xffffffff),0,MVar9);
        std::__cxx11::string::~string((string *)&elementApiName);
        std::__cxx11::string::~string((string *)&elementSrcName);
        std::__cxx11::string::~string((string *)&op);
      }
      return;
    }
    pcVar7 = "[0]";
    bVar1 = true;
  }
  dataType = resultVar_00[2];
  pcVar5 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string((string *)&op,(string *)srcName);
  std::operator+(&fullApiName,&op,pcVar7);
  std::__cxx11::string::~string((string *)&op);
  pUVar2 = local_58;
  iVar3 = UniformLayout::getUniformLayoutIndex(local_58,(int)layout,&fullApiName);
  entry = (pUVar2->uniforms).
          super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
          ._M_impl.super__Vector_impl_data._M_start + iVar3;
  if (bVar1) {
    for (iVar3 = 0; iVar3 < *(int *)(resultVar + 0x10); iVar3 = iVar3 + 1) {
      poVar6 = std::operator<<((ostream *)src,"\tresult *= compare_");
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = std::operator<<(poVar6,(string *)type);
      poVar6 = std::operator<<(poVar6,"[");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::operator<<(poVar6,"], ");
      generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),iVar3);
      std::operator<<((ostream *)src,");\n");
    }
    goto LAB_00668aad;
  }
  if (unusedMask == 0) {
    pcVar7 = glu::getDataTypeName(dataType);
    poVar6 = std::operator<<((ostream *)src,"\tresult *= compare_");
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = std::operator<<(poVar6,(string *)type);
    std::operator<<(poVar6,", ");
    generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),0);
    std::operator<<((ostream *)src,");\n");
    goto LAB_00668aad;
  }
  uVar8 = dataType - TYPE_FLOAT_MAT2;
  if (8 < uVar8) goto LAB_00668aad;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&op,"compare_",(allocator<char> *)&elementSrcName);
  switch(uVar8) {
  case 0:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec2",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(2,2,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 1:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec3",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(2,3,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 2:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec4",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(2,4,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  default:
    goto switchD_0066847b_caseD_3;
  case 5:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec4",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(3,4,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 6:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec2",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(4,2,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 7:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec3",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(4,3,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 8:
    std::__cxx11::string::string((string *)&elementSrcName,(string *)&op);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elementApiName,"vec4",(allocator<char> *)&local_78);
    writeMatrixTypeSrc(4,4,&elementSrcName,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
  }
  std::__cxx11::string::~string((string *)&elementApiName);
  std::__cxx11::string::~string((string *)&elementSrcName);
switchD_0066847b_caseD_3:
  std::__cxx11::string::~string((string *)&op);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&op,"compare_",(allocator<char> *)&elementSrcName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elementSrcName,"float",(allocator<char> *)&elementApiName);
  switch(uVar8) {
  case 0:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(2,2,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 1:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(2,3,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 2:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(2,4,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  default:
    goto switchD_0066880d_caseD_3;
  case 5:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(3,4,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 6:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(4,2,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 7:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(4,3,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    break;
  case 8:
    std::__cxx11::string::string((string *)&elementApiName,(string *)&op);
    std::__cxx11::string::string((string *)&local_78,(string *)&elementSrcName);
    writeMatrixTypeSrc(4,4,&elementApiName,&local_78,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
  }
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&elementApiName);
switchD_0066880d_caseD_3:
  std::__cxx11::string::~string((string *)&elementSrcName);
  std::__cxx11::string::~string((string *)&op);
LAB_00668aad:
  std::__cxx11::string::~string((string *)&fullApiName);
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream&	src,
						 const char*			resultVar,
						 const VarType&			type,
						 const std::string&		srcName,
						 const std::string&		apiName,
						 const UniformLayout&	layout,
						 int					blockNdx,
						 const void*			basePtr,
						 deUint32				unusedMask,
						 MatrixLoadFlags		matrixLoadFlag)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= std::string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformLayoutIndex(blockNdx, fullApiName);
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			generateSingleCompare(src, elementType, srcName, basePtr, entry, matrixLoadFlag);
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = std::string("[") + de::toString(elementNdx) + "]";
			std::string elementSrcName = std::string(srcName) + op;
			std::string elementApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, elementType, elementSrcName, elementApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			std::string op = std::string(".") + memberIter->getName();
			std::string memberSrcName = std::string(srcName) + op;
			std::string memberApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, memberIter->getType(), memberSrcName, memberApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
}